

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedNegative.cpp
# Opt level: O1

IterateResult __thiscall
glcts::DrawBuffersIndexedNegative::iterate(DrawBuffersIndexedNegative *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  int iVar34;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  GLboolean bData;
  GLint maxDrawBuffers;
  GLint data;
  GLint64 data64;
  undefined1 local_41;
  undefined4 local_40;
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  long lVar35;
  
  iVar34 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar35 = CONCAT44(extraout_var,iVar34);
  (**(code **)(lVar35 + 0x868))(0x8824,&local_40);
  (**(code **)(lVar35 + 0x118))(local_40,0x8007);
  bVar1 = ExpectedError(this,0x501,"glBlendEquationi(0, maxDrawBuffers)");
  (**(code **)(lVar35 + 0x110))(local_40,0x8007,0x8007);
  bVar2 = ExpectedError(this,0x501,"glBlendEquationSeparatei(0, maxDrawBuffers)");
  (**(code **)(lVar35 + 0x130))(local_40,0x8001,0x304,0x302,1);
  bVar3 = ExpectedError(this,0x501,
                        "glBlendFuncSeparatei(maxDrawBuffers, GL_CONSTANT_COLOR, GL_DST_ALPHA, GL_SRC_ALPHA, GL_ONE)"
                       );
  (**(code **)(lVar35 + 0x138))(local_40,0,0x300);
  bVar4 = ExpectedError(this,0x501,"glBlendFunci(maxDrawBuffers, GL_ZERO, GL_SRC_COLOR)");
  (**(code **)(lVar35 + 0x860))(0x8009,local_40,local_3c);
  bVar5 = ExpectedError(this,0x501,"glGetIntegeri_v(GL_BLEND_EQUATION_RGB, maxDrawBuffers, &data)");
  (**(code **)(lVar35 + 0x860))(0x883d,local_40,local_3c);
  bVar6 = ExpectedError(this,0x501,"glGetIntegeri_v(GL_BLEND_EQUATION_ALPHA, maxDrawBuffers, &data)"
                       );
  (**(code **)(lVar35 + 0x860))(0x80c9,local_40,local_3c);
  bVar7 = ExpectedError(this,0x501,"glGetIntegeri_v(GL_BLEND_SRC_RGB, maxDrawBuffers, &data)");
  (**(code **)(lVar35 + 0x860))(0x80cb,local_40,local_3c);
  bVar8 = ExpectedError(this,0x501,"glGetIntegeri_v(GL_BLEND_SRC_ALPHA, maxDrawBuffers, &data)");
  (**(code **)(lVar35 + 0x860))(0x80c8,local_40,local_3c);
  bVar9 = ExpectedError(this,0x501,"glGetIntegeri_v(GL_BLEND_DST_RGB, maxDrawBuffers, &data)");
  (**(code **)(lVar35 + 0x860))(0x80ca,local_40,local_3c);
  bVar10 = ExpectedError(this,0x501,"glGetIntegeri_v(GL_BLEND_DST_ALPHA, maxDrawBuffers, &data)");
  (**(code **)(lVar35 + 0x848))(0x8009,local_40,local_38);
  bVar11 = ExpectedError(this,0x501,
                         "glGetInteger64i_v(GL_BLEND_EQUATION_RGB, maxDrawBuffers, &data64)");
  (**(code **)(lVar35 + 0x848))(0x883d,local_40,local_38);
  bVar12 = ExpectedError(this,0x501,
                         "glGetInteger64i_v(GL_BLEND_EQUATION_ALPHA, maxDrawBuffers, &data64)");
  (**(code **)(lVar35 + 0x848))(0x80c9,local_40,local_38);
  bVar13 = ExpectedError(this,0x501,"glGetInteger64i_v(GL_BLEND_SRC_RGB, maxDrawBuffers, &data64)");
  (**(code **)(lVar35 + 0x848))(0x80cb,local_40,local_38);
  bVar14 = ExpectedError(this,0x501,"glGetInteger64i_v(GL_BLEND_SRC_ALPHA, maxDrawBuffers, &data64)"
                        );
  (**(code **)(lVar35 + 0x848))(0x80c8,local_40,local_38);
  bVar15 = ExpectedError(this,0x501,"glGetInteger64i_v(GL_BLEND_DST_RGB, maxDrawBuffers, &data64)");
  (**(code **)(lVar35 + 0x848))(0x80ca,local_40,local_38);
  bVar16 = ExpectedError(this,0x501,"glGetInteger64i_v(GL_BLEND_DST_ALPHA, maxDrawBuffers, &data64)"
                        );
  (**(code **)(lVar35 + 0x618))(0xbe2,local_40);
  bVar17 = ExpectedError(this,0x501,"glEnablei(GL_BLEND, maxDrawBuffers)");
  (**(code **)(lVar35 + 0x520))(0xbe2,local_40);
  bVar18 = ExpectedError(this,0x501,"glDisablei(GL_BLEND, maxDrawBuffers)");
  (**(code **)(lVar35 + 0xc80))(0xbe2,local_40);
  bVar19 = ExpectedError(this,0x501,"glIsEnabledi(GL_BLEND, maxDrawBuffers)");
  (**(code **)(lVar35 + 0x240))(local_40,0,1,0,1);
  bVar20 = ExpectedError(this,0x501,
                         "glColorMaski(maxDrawBuffers, GL_FALSE, GL_TRUE, GL_FALSE, GL_TRUE)");
  (**(code **)(lVar35 + 0x790))(0xc23,local_40,&local_41);
  bVar21 = ExpectedError(this,0x501,"glGetBooleani_v(GL_COLOR_WRITEMASK, maxDrawBuffers, &bData)");
  (**(code **)(lVar35 + 0x138))(0,0x8007,0x303);
  bVar22 = ExpectedError(this,0x500,"glBlendFunci(0, GL_MIN, GL_ONE_MINUS_SRC_ALPHA)");
  (**(code **)(lVar35 + 0x138))(0,0x302,0x8007);
  bVar23 = ExpectedError(this,0x500,"glBlendFunci(0, GL_SRC_ALPHA, GL_MIN)");
  (**(code **)(lVar35 + 0x130))(0,0x8007,1,1,1);
  bVar24 = ExpectedError(this,0x500,"glBlendFuncSeparatei(0, GL_MIN, GL_ONE, GL_ONE, GL_ONE)");
  (**(code **)(lVar35 + 0x130))(0,1,0x8007,1,1);
  bVar25 = ExpectedError(this,0x500,"glBlendFuncSeparatei(0, GL_ONE, GL_MIN, GL_ONE, GL_ONE)");
  (**(code **)(lVar35 + 0x130))(0,1,1,0x8007,1);
  bVar26 = ExpectedError(this,0x500,"glBlendFuncSeparatei(0, GL_ONE, GL_ONE, GL_MIN, GL_ONE)");
  (**(code **)(lVar35 + 0x130))(0,1,1,1,0x8007);
  bVar27 = ExpectedError(this,0x500,"glBlendFuncSeparatei(0, GL_ONE, GL_ONE, GL_ONE, GL_MIN)");
  (**(code **)(lVar35 + 0x118))(0,0x302);
  bVar28 = ExpectedError(this,0x500,"glBlendEquationi(0, GL_SRC_ALPHA)");
  (**(code **)(lVar35 + 0x110))(0,0x302,0x8007);
  bVar29 = ExpectedError(this,0x500,"glBlendEquationSeparatei(0, GL_SRC_ALPHA, GL_MIN)");
  (**(code **)(lVar35 + 0x110))(0,0x8007,0x302);
  bVar30 = ExpectedError(this,0x500,"glBlendEquationSeparatei(0, GL_MIN, GL_SRC_ALPHA)");
  (**(code **)(lVar35 + 0x618))(0x8006,0);
  bVar31 = ExpectedError(this,0x500,"glEnablei(GL_FUNC_ADD, 0)");
  (**(code **)(lVar35 + 0x520))(0x8006,0);
  bVar32 = ExpectedError(this,0x500,"glDisablei(GL_FUNC_ADD, 0)");
  (**(code **)(lVar35 + 0xc80))(0x8006,0);
  bVar33 = ExpectedError(this,0x500,"glIsEnabledi(GL_FUNC_ADD, 0)");
  if (((((((((bVar1) && (bVar2)) && (bVar3)) &&
          (((bVar4 && (bVar5)) && ((bVar6 && ((bVar7 && (bVar8)))))))) && (bVar9)) &&
        (((((bVar10 && (bVar11)) && (bVar12)) && ((bVar13 && (bVar14)))) && (bVar15)))) &&
       (((bVar16 && (bVar17)) &&
        (((bVar18 && (((bVar19 && (bVar20)) && (bVar21)))) && (((bVar22 && (bVar23)) && (bVar24)))))
        ))) && (((bVar25 && (bVar26)) && ((bVar27 && (((bVar28 && (bVar29)) && (bVar30)))))))) &&
     (((bVar31 && (bVar32)) && (bVar33)))) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    description = "Negative test failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedNegative::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint	 data;
	glw::GLint64   data64;
	glw::GLboolean bData;
	glw::GLint	 maxDrawBuffers;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);

	bool success = true;

	// INVALID_VALUE
	gl.blendEquationi(maxDrawBuffers, GL_MIN);
	success &= ExpectedError(GL_INVALID_VALUE, "glBlendEquationi(0, maxDrawBuffers)");

	gl.blendEquationSeparatei(maxDrawBuffers, GL_MIN, GL_MIN);
	success &= ExpectedError(GL_INVALID_VALUE, "glBlendEquationSeparatei(0, maxDrawBuffers)");

	gl.blendFuncSeparatei(maxDrawBuffers, GL_CONSTANT_COLOR, GL_DST_ALPHA, GL_SRC_ALPHA, GL_ONE);
	success &=
		ExpectedError(GL_INVALID_VALUE,
					  "glBlendFuncSeparatei(maxDrawBuffers, GL_CONSTANT_COLOR, GL_DST_ALPHA, GL_SRC_ALPHA, GL_ONE)");

	gl.blendFunci(maxDrawBuffers, GL_ZERO, GL_SRC_COLOR);
	success &= ExpectedError(GL_INVALID_VALUE, "glBlendFunci(maxDrawBuffers, GL_ZERO, GL_SRC_COLOR)");

	gl.getIntegeri_v(GL_BLEND_EQUATION_RGB, maxDrawBuffers, &data);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetIntegeri_v(GL_BLEND_EQUATION_RGB, maxDrawBuffers, &data)");

	gl.getIntegeri_v(GL_BLEND_EQUATION_ALPHA, maxDrawBuffers, &data);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetIntegeri_v(GL_BLEND_EQUATION_ALPHA, maxDrawBuffers, &data)");

	gl.getIntegeri_v(GL_BLEND_SRC_RGB, maxDrawBuffers, &data);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetIntegeri_v(GL_BLEND_SRC_RGB, maxDrawBuffers, &data)");

	gl.getIntegeri_v(GL_BLEND_SRC_ALPHA, maxDrawBuffers, &data);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetIntegeri_v(GL_BLEND_SRC_ALPHA, maxDrawBuffers, &data)");

	gl.getIntegeri_v(GL_BLEND_DST_RGB, maxDrawBuffers, &data);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetIntegeri_v(GL_BLEND_DST_RGB, maxDrawBuffers, &data)");

	gl.getIntegeri_v(GL_BLEND_DST_ALPHA, maxDrawBuffers, &data);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetIntegeri_v(GL_BLEND_DST_ALPHA, maxDrawBuffers, &data)");

	gl.getInteger64i_v(GL_BLEND_EQUATION_RGB, maxDrawBuffers, &data64);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetInteger64i_v(GL_BLEND_EQUATION_RGB, maxDrawBuffers, &data64)");

	gl.getInteger64i_v(GL_BLEND_EQUATION_ALPHA, maxDrawBuffers, &data64);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetInteger64i_v(GL_BLEND_EQUATION_ALPHA, maxDrawBuffers, &data64)");

	gl.getInteger64i_v(GL_BLEND_SRC_RGB, maxDrawBuffers, &data64);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetInteger64i_v(GL_BLEND_SRC_RGB, maxDrawBuffers, &data64)");

	gl.getInteger64i_v(GL_BLEND_SRC_ALPHA, maxDrawBuffers, &data64);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetInteger64i_v(GL_BLEND_SRC_ALPHA, maxDrawBuffers, &data64)");

	gl.getInteger64i_v(GL_BLEND_DST_RGB, maxDrawBuffers, &data64);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetInteger64i_v(GL_BLEND_DST_RGB, maxDrawBuffers, &data64)");

	gl.getInteger64i_v(GL_BLEND_DST_ALPHA, maxDrawBuffers, &data64);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetInteger64i_v(GL_BLEND_DST_ALPHA, maxDrawBuffers, &data64)");

	gl.enablei(GL_BLEND, maxDrawBuffers);
	success &= ExpectedError(GL_INVALID_VALUE, "glEnablei(GL_BLEND, maxDrawBuffers)");

	gl.disablei(GL_BLEND, maxDrawBuffers);
	success &= ExpectedError(GL_INVALID_VALUE, "glDisablei(GL_BLEND, maxDrawBuffers)");

	gl.isEnabledi(GL_BLEND, maxDrawBuffers);
	success &= ExpectedError(GL_INVALID_VALUE, "glIsEnabledi(GL_BLEND, maxDrawBuffers)");

	gl.colorMaski(maxDrawBuffers, GL_FALSE, GL_TRUE, GL_FALSE, GL_TRUE);
	success &= ExpectedError(GL_INVALID_VALUE, "glColorMaski(maxDrawBuffers, GL_FALSE, GL_TRUE, GL_FALSE, GL_TRUE)");

	gl.getBooleani_v(GL_COLOR_WRITEMASK, maxDrawBuffers, &bData);
	success &= ExpectedError(GL_INVALID_VALUE, "glGetBooleani_v(GL_COLOR_WRITEMASK, maxDrawBuffers, &bData)");

	// INVALID_ENUM
	gl.blendFunci(0, GL_MIN, GL_ONE_MINUS_SRC_ALPHA);
	success &= ExpectedError(GL_INVALID_ENUM, "glBlendFunci(0, GL_MIN, GL_ONE_MINUS_SRC_ALPHA)");

	gl.blendFunci(0, GL_SRC_ALPHA, GL_MIN);
	success &= ExpectedError(GL_INVALID_ENUM, "glBlendFunci(0, GL_SRC_ALPHA, GL_MIN)");

	gl.blendFuncSeparatei(0, GL_MIN, GL_ONE, GL_ONE, GL_ONE);
	success &= ExpectedError(GL_INVALID_ENUM, "glBlendFuncSeparatei(0, GL_MIN, GL_ONE, GL_ONE, GL_ONE)");

	gl.blendFuncSeparatei(0, GL_ONE, GL_MIN, GL_ONE, GL_ONE);
	success &= ExpectedError(GL_INVALID_ENUM, "glBlendFuncSeparatei(0, GL_ONE, GL_MIN, GL_ONE, GL_ONE)");

	gl.blendFuncSeparatei(0, GL_ONE, GL_ONE, GL_MIN, GL_ONE);
	success &= ExpectedError(GL_INVALID_ENUM, "glBlendFuncSeparatei(0, GL_ONE, GL_ONE, GL_MIN, GL_ONE)");

	gl.blendFuncSeparatei(0, GL_ONE, GL_ONE, GL_ONE, GL_MIN);
	success &= ExpectedError(GL_INVALID_ENUM, "glBlendFuncSeparatei(0, GL_ONE, GL_ONE, GL_ONE, GL_MIN)");

	gl.blendEquationi(0, GL_SRC_ALPHA);
	success &= ExpectedError(GL_INVALID_ENUM, "glBlendEquationi(0, GL_SRC_ALPHA)");

	gl.blendEquationSeparatei(0, GL_SRC_ALPHA, GL_MIN);
	success &= ExpectedError(GL_INVALID_ENUM, "glBlendEquationSeparatei(0, GL_SRC_ALPHA, GL_MIN)");

	gl.blendEquationSeparatei(0, GL_MIN, GL_SRC_ALPHA);
	success &= ExpectedError(GL_INVALID_ENUM, "glBlendEquationSeparatei(0, GL_MIN, GL_SRC_ALPHA)");

	gl.enablei(GL_FUNC_ADD, 0);
	success &= ExpectedError(GL_INVALID_ENUM, "glEnablei(GL_FUNC_ADD, 0)");

	gl.disablei(GL_FUNC_ADD, 0);
	success &= ExpectedError(GL_INVALID_ENUM, "glDisablei(GL_FUNC_ADD, 0)");

	gl.isEnabledi(GL_FUNC_ADD, 0);
	success &= ExpectedError(GL_INVALID_ENUM, "glIsEnabledi(GL_FUNC_ADD, 0)");

	if (success)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Negative test failed");
	}
	return STOP;
}